

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O2

sc_signed * sc_dt::operator/(sc_signed *__return_storage_ptr__,unsigned_long u,sc_signed *v)

{
  int s;
  sc_digit ud [3];
  
  s = v->sgn;
  if (u == 0 || s == 0) {
    div_by_zero<int>(s);
    sc_length_param::sc_length_param((sc_length_param *)ud);
    sc_signed::sc_signed(__return_storage_ptr__,ud[0]);
  }
  else {
    from_uint<unsigned_long>(3,ud,u);
    div_signed_friend(__return_storage_ptr__,(uint)(s == 1) * 2 + -1,0x40,3,ud,v->nbits,v->ndigits,
                      v->digit);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator/(unsigned long u, const sc_signed& v)
{

  small_type s = mul_signs(v.sgn, get_sign(u));

  if (s == SC_ZERO) {
    div_by_zero(v.sgn);  // case 1
    return sc_signed();  // case 2

  }

  CONVERT_LONG_2(u);

  // other cases
  return div_signed_friend(s, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.nbits, v.ndigits, v.digit);

}